

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmatrix.h
# Opt level: O2

int __thiscall gmath::DMatrix<double>::init(DMatrix<double> *this,EVP_PKEY_CTX *ctx)

{
  double *in_RAX;
  double *extraout_RAX;
  int i;
  ulong uVar1;
  int in_EDX;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  
  if (this->v != (double *)0x0) {
    operator_delete__(this->v);
    in_RAX = extraout_RAX;
  }
  this->nrows = (int)ctx;
  this->ncols = in_EDX;
  uVar3 = (int)ctx * in_EDX;
  this->n = uVar3;
  this->v = (double *)0x0;
  if (0 < (int)uVar3) {
    uVar4 = (ulong)uVar3;
    in_RAX = (double *)operator_new__(uVar4 * 8);
    this->v = in_RAX;
    for (uVar1 = 0; uVar4 != uVar1; uVar1 = uVar1 + 1) {
      in_RAX[uVar1] = 0.0;
    }
    for (lVar2 = 0; lVar2 < (long)uVar4; lVar2 = lVar2 + (in_EDX + 1)) {
      in_RAX[lVar2] = 1.0;
    }
  }
  return (int)in_RAX;
}

Assistant:

void init(int rows=0, int cols=0)
    {
      if (v != 0)
      {
        delete [] v;
      }

      nrows=rows;
      ncols=cols;
      n=nrows*ncols;

      v=0;

      if (n > 0)
      {
        v=new T[n];

        for (int i=0; i<n; i++)
        {
          v[i]=0;
        }

        for (int i=0; i<n; i+=cols+1)
        {
          v[i]=1;
        }
      }
    }